

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructHelpers.h
# Opt level: O2

void Corrade::Containers::Implementation::
     construct<Corrade::Utility::Arguments::Entry,Corrade::Utility::Arguments::Type,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long>
               (Entry *value,Type *first,char *next,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_3,
               unsigned_long *next_4)

{
  Type type;
  char shortKey;
  string local_90;
  string local_70;
  string local_50;
  
  type = *first;
  shortKey = *next;
  std::__cxx11::string::string((string *)&local_90,(string *)next_1);
  std::__cxx11::string::string((string *)&local_50,(string *)next_2);
  std::__cxx11::string::string((string *)&local_70,(string *)next_3);
  Utility::Arguments::Entry::Entry(value,type,shortKey,&local_90,&local_50,&local_70,*next_4);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

inline void construct(T& value, First&& first, Next&& ...next) {
    new(&value) T{Utility::forward<First>(first), Utility::forward<Next>(next)...};
}